

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test25(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_data p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  char *pcVar9;
  char *__s1;
  double dVar10;
  size_t length;
  QPDF_BOOL b;
  uint u;
  int i;
  char *n;
  char *utf8;
  char *str;
  char *r;
  double d;
  unsigned_long_long ul;
  longlong l;
  long local_98;
  undefined4 local_90;
  int local_8c;
  int local_88;
  int local_84;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  double local_50;
  long local_48;
  long local_40;
  char *local_38;
  
  local_38 = outfile;
  qpdf_read(qpdf,infile,password);
  local_5c = qpdf_get_root(qpdf);
  uVar2 = qpdf_oh_parse(qpdf,anon_var_dwarf_8ff);
  uVar3 = qpdf_oh_get_array_item(qpdf,uVar2,0);
  uVar4 = qpdf_oh_get_array_item(qpdf,uVar2,1);
  uVar5 = qpdf_oh_get_array_item(qpdf,uVar2,2);
  uVar6 = qpdf_oh_get_array_item(qpdf,uVar2,3);
  local_54 = qpdf_oh_get_array_item(qpdf,uVar2,4);
  uVar7 = qpdf_oh_get_array_item(qpdf,uVar2,5);
  local_58 = qpdf_oh_get_array_item(qpdf,uVar2,6);
  local_90 = qpdf_oh_get_array_item(qpdf,uVar2,7);
  iVar8 = qpdf_oh_is_integer(qpdf,uVar3);
  if (iVar8 != 0) {
    iVar8 = qpdf_oh_get_int_value_as_int(qpdf,uVar3);
    if (iVar8 == 1) {
      local_40 = 0;
      iVar8 = qpdf_oh_get_value_as_longlong(qpdf,uVar7);
      if (iVar8 != 0) {
        __assert_fail("qpdf_oh_get_value_as_longlong(qpdf, p_bool, &l) == QPDF_FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2a4,"void test25(const char *, const char *, const char *, const char *)");
      }
      iVar8 = qpdf_oh_get_value_as_longlong(qpdf,uVar3,&local_40);
      if ((iVar8 != 1) || (local_40 != 1)) {
        __assert_fail("(qpdf_oh_get_value_as_longlong(qpdf, p_int, &l) == QPDF_TRUE) && (l == 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2a5,"void test25(const char *, const char *, const char *, const char *)");
      }
      local_84 = 0;
      iVar8 = qpdf_oh_get_value_as_int(qpdf,uVar7);
      if (iVar8 != 0) {
        __assert_fail("qpdf_oh_get_value_as_int(qpdf, p_bool, &i) == QPDF_FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2a7,"void test25(const char *, const char *, const char *, const char *)");
      }
      iVar8 = qpdf_oh_get_value_as_int(qpdf,uVar3,&local_84);
      if ((iVar8 != 1) || (local_84 != 1)) {
        __assert_fail("(qpdf_oh_get_value_as_int(qpdf, p_int, &i) == QPDF_TRUE) && (i == 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2a8,"void test25(const char *, const char *, const char *, const char *)");
      }
      local_48 = 0;
      iVar8 = qpdf_oh_get_value_as_ulonglong(qpdf,uVar7);
      if (iVar8 != 0) {
        __assert_fail("qpdf_oh_get_value_as_ulonglong(qpdf, p_bool, &ul) == QPDF_FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2aa,"void test25(const char *, const char *, const char *, const char *)");
      }
      iVar8 = qpdf_oh_get_value_as_ulonglong(qpdf,uVar3,&local_48);
      if ((iVar8 != 1) || (local_48 != 1)) {
        __assert_fail("(qpdf_oh_get_value_as_ulonglong(qpdf, p_int, &ul) == QPDF_TRUE) && (ul == 1u)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2ab,"void test25(const char *, const char *, const char *, const char *)");
      }
      local_88 = 0;
      iVar8 = qpdf_oh_get_value_as_uint(qpdf,uVar7);
      if (iVar8 != 0) {
        __assert_fail("qpdf_oh_get_value_as_uint(qpdf, p_bool, &u) == QPDF_FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2ad,"void test25(const char *, const char *, const char *, const char *)");
      }
      iVar8 = qpdf_oh_get_value_as_uint(qpdf,uVar3,&local_88);
      if ((iVar8 != 1) || (local_88 != 1)) {
        __assert_fail("(qpdf_oh_get_value_as_uint(qpdf, p_int, &u) == QPDF_TRUE) && (u == 1u)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2ae,"void test25(const char *, const char *, const char *, const char *)");
      }
      local_50 = 0.0;
      iVar8 = qpdf_oh_get_value_as_number(qpdf,uVar7);
      if (iVar8 != 0) {
        __assert_fail("qpdf_oh_get_value_as_number(qpdf, p_bool, &d) == QPDF_FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2b0,"void test25(const char *, const char *, const char *, const char *)");
      }
      iVar8 = qpdf_oh_get_value_as_number(qpdf,uVar3,&local_50);
      if ((iVar8 != 1) || (1e-06 <= ABS(local_50 + -1.0))) {
        __assert_fail("(qpdf_oh_get_value_as_number(qpdf, p_int, &d) == QPDF_TRUE) && ((d - 1.0) < 1e-6) && ((d - 1.0) > -1e-6)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2b3,"void test25(const char *, const char *, const char *, const char *)");
      }
      iVar8 = qpdf_oh_get_type_code(qpdf,uVar3);
      if (iVar8 != 4) {
        __assert_fail("qpdf_oh_get_type_code(qpdf, p_int) == ot_integer",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2b4,"void test25(const char *, const char *, const char *, const char *)");
      }
      pcVar9 = (char *)qpdf_oh_get_type_name(qpdf,uVar3);
      iVar8 = strcmp(pcVar9,"integer");
      if (iVar8 != 0) {
        __assert_fail("strcmp(qpdf_oh_get_type_name(qpdf, p_int), \"integer\") == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x2b5,"void test25(const char *, const char *, const char *, const char *)");
      }
      iVar8 = qpdf_oh_is_real(qpdf,uVar4);
      if (iVar8 != 0) {
        pcVar9 = (char *)qpdf_oh_get_real_value(qpdf,uVar4);
        iVar8 = strcmp(pcVar9,"2.0");
        if (iVar8 == 0) {
          dVar10 = (double)qpdf_oh_get_numeric_value(qpdf,uVar4);
          if ((dVar10 == 2.0) && (!NAN(dVar10))) {
            local_68 = "";
            local_98 = 0;
            iVar8 = qpdf_oh_get_value_as_real(qpdf,local_90);
            if (((iVar8 != 0) || (*local_68 != '\0')) || (local_98 != 0)) {
              __assert_fail("(qpdf_oh_get_value_as_real(qpdf, p_name, &r, &length) == QPDF_FALSE) && (strcmp(r, \"\") == 0) && (length == 0)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                            ,0x2be,
                            "void test25(const char *, const char *, const char *, const char *)");
            }
            iVar8 = qpdf_oh_get_value_as_real(qpdf,uVar4,&local_68,&local_98);
            if (iVar8 == 1) {
              iVar8 = strcmp(local_68,"2.0");
              if ((iVar8 == 0) && (local_98 == 3)) {
                iVar8 = qpdf_oh_get_type_code(qpdf,uVar4);
                if (iVar8 != 5) {
                  __assert_fail("qpdf_oh_get_type_code(qpdf, p_real) == ot_real",
                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                ,0x2c2,
                                "void test25(const char *, const char *, const char *, const char *)"
                               );
                }
                pcVar9 = (char *)qpdf_oh_get_type_name(qpdf,uVar4);
                iVar8 = strcmp(pcVar9,"real");
                if (iVar8 != 0) {
                  __assert_fail("strcmp(qpdf_oh_get_type_name(qpdf, p_real), \"real\") == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                ,0x2c3,
                                "void test25(const char *, const char *, const char *, const char *)"
                               );
                }
                iVar8 = qpdf_oh_is_string(qpdf,uVar5);
                if (iVar8 != 0) {
                  pcVar9 = (char *)qpdf_oh_get_string_value(qpdf,uVar5);
                  if (((*pcVar9 == '3') && (pcVar9[1] == -9)) && (pcVar9[2] == '\0')) {
                    pcVar9 = (char *)qpdf_oh_get_utf8_value(qpdf,uVar5);
                    iVar8 = strcmp(pcVar9,anon_var_dwarf_aaf);
                    if (iVar8 == 0) {
                      pcVar9 = (char *)qpdf_oh_unparse_binary(qpdf,uVar5);
                      iVar8 = strcmp(pcVar9,"<33f7>");
                      if (iVar8 == 0) {
                        local_70 = "";
                        local_98 = 0;
                        iVar8 = qpdf_oh_get_value_as_string(qpdf,local_90);
                        if (((iVar8 != 0) || (*local_70 != '\0')) || (local_98 != 0)) {
                          __assert_fail("(qpdf_oh_get_value_as_string(qpdf, p_name, &str, &length) == QPDF_FALSE) && (strcmp(str, \"\") == 0) && (length == 0)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                        ,0x2cd,
                                        "void test25(const char *, const char *, const char *, const char *)"
                                       );
                        }
                        iVar8 = qpdf_oh_get_value_as_string(qpdf,uVar5,&local_70,&local_98);
                        if (((iVar8 != 1) || (*local_70 != '3')) ||
                           ((local_70[1] != -9 || ((local_70[2] != '\0' || (local_98 != 2)))))) {
                          __assert_fail("(qpdf_oh_get_value_as_string(qpdf, p_string, &str, &length) == QPDF_TRUE) && (strcmp(str, \"3\\xf7\") == 0) && (length == 2)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                        ,0x2d0,
                                        "void test25(const char *, const char *, const char *, const char *)"
                                       );
                        }
                        local_78 = "";
                        local_98 = 0;
                        iVar8 = qpdf_oh_get_value_as_utf8(qpdf,local_90);
                        if (((iVar8 != 0) || (*local_78 != '\0')) || (local_98 != 0)) {
                          __assert_fail("(qpdf_oh_get_value_as_utf8(qpdf, p_name, &utf8, &length) == QPDF_FALSE) && (strcmp(utf8, \"\") == 0) && (length == 0)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                        ,0x2d5,
                                        "void test25(const char *, const char *, const char *, const char *)"
                                       );
                        }
                        iVar8 = qpdf_oh_get_value_as_utf8(qpdf,uVar5,&local_78,&local_98);
                        if (iVar8 == 1) {
                          iVar8 = strcmp(local_78,anon_var_dwarf_aaf);
                          if ((iVar8 == 0) && (local_98 == 3)) {
                            iVar8 = qpdf_oh_get_type_code(qpdf,uVar5);
                            if (iVar8 != 6) {
                              __assert_fail("qpdf_oh_get_type_code(qpdf, p_string) == ot_string",
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2d9,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            iVar8 = qpdf_oh_is_name_and_equals(qpdf,uVar5,anon_var_dwarf_aa3);
                            if (iVar8 != 0) {
                              __assert_fail("!qpdf_oh_is_name_and_equals(qpdf, p_string, \"3\\xf7\")"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2da,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            pcVar9 = (char *)qpdf_oh_get_type_name(qpdf,uVar5);
                            iVar8 = strcmp(pcVar9,"string");
                            if (iVar8 != 0) {
                              __assert_fail("strcmp(qpdf_oh_get_type_name(qpdf, p_string), \"string\") == 0"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2db,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            iVar8 = qpdf_oh_is_dictionary(qpdf,uVar6);
                            if (iVar8 == 0) {
                              __assert_fail("qpdf_oh_is_dictionary(qpdf, p_dict)",
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2dc,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            uVar4 = qpdf_oh_get_key(qpdf,uVar6,"/Four");
                            iVar8 = qpdf_oh_is_or_has_name(qpdf,uVar4,"/Five");
                            if (iVar8 == 0) {
                              __assert_fail("qpdf_oh_is_or_has_name(qpdf, p_five, \"/Five\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2de,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            iVar8 = qpdf_oh_is_name_and_equals(qpdf,uVar4,"/Five");
                            p_Var1 = qpdf;
                            if (iVar8 != 0) {
                              __assert_fail("!qpdf_oh_is_name_and_equals(qpdf, p_five, \"/Five\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2df,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            uVar6 = qpdf_oh_get_array_item(qpdf,uVar4,0);
                            iVar8 = qpdf_oh_is_or_has_name(p_Var1,uVar6,"/Five");
                            p_Var1 = qpdf;
                            if (iVar8 == 0) {
                              __assert_fail("qpdf_oh_is_or_has_name(qpdf, qpdf_oh_get_array_item(qpdf, p_five, 0), \"/Five\")"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2e0,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            uVar4 = qpdf_oh_get_array_item(qpdf,uVar4,0);
                            iVar8 = qpdf_oh_is_name_and_equals(p_Var1,uVar4,"/Five");
                            uVar4 = local_54;
                            if (iVar8 == 0) {
                              __assert_fail("qpdf_oh_is_name_and_equals(qpdf, qpdf_oh_get_array_item(qpdf, p_five, 0), \"/Five\")"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2e1,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            iVar8 = qpdf_oh_is_null(qpdf,local_54);
                            if (iVar8 == 0) {
                              __assert_fail("qpdf_oh_is_null(qpdf, p_null)",
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2e2,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            iVar8 = qpdf_oh_get_type_code(qpdf,uVar4);
                            if (iVar8 != 2) {
                              __assert_fail("qpdf_oh_get_type_code(qpdf, p_null) == ot_null",
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2e3,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            pcVar9 = (char *)qpdf_oh_get_type_name(qpdf,uVar4);
                            iVar8 = strcmp(pcVar9,"null");
                            if (iVar8 != 0) {
                              __assert_fail("strcmp(qpdf_oh_get_type_name(qpdf, p_null), \"null\") == 0"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                            ,0x2e4,
                                            "void test25(const char *, const char *, const char *, const char *)"
                                           );
                            }
                            iVar8 = qpdf_oh_is_bool(qpdf,uVar7);
                            if (iVar8 != 0) {
                              iVar8 = qpdf_oh_get_bool_value(qpdf,uVar7);
                              if (iVar8 == 1) {
                                local_8c = 0;
                                iVar8 = qpdf_oh_get_value_as_bool(qpdf,uVar3,&local_8c);
                                if (iVar8 != 0 || local_8c != 0) {
                                  __assert_fail("(qpdf_oh_get_value_as_bool(qpdf, p_int, &b) == QPDF_FALSE) && b == QPDF_FALSE"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                ,0x2e7,
                                                "void test25(const char *, const char *, const char *, const char *)"
                                               );
                                }
                                iVar8 = qpdf_oh_get_value_as_bool(qpdf,uVar7,&local_8c);
                                pcVar9 = local_38;
                                if ((iVar8 != 1) || (local_8c != 1)) {
                                  __assert_fail("(qpdf_oh_get_value_as_bool(qpdf, p_bool, &b) == QPDF_TRUE) && b == QPDF_TRUE"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                ,0x2e8,
                                                "void test25(const char *, const char *, const char *, const char *)"
                                               );
                                }
                                iVar8 = qpdf_oh_get_value_as_bool(qpdf,local_58,&local_8c);
                                if ((iVar8 != 1) || (local_8c != 0)) {
                                  __assert_fail("(qpdf_oh_get_value_as_bool(qpdf, p_bool_f, &b) == QPDF_TRUE) && b == QPDF_FALSE"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                ,0x2e9,
                                                "void test25(const char *, const char *, const char *, const char *)"
                                               );
                                }
                                iVar8 = qpdf_oh_get_type_code(qpdf,uVar7);
                                if (iVar8 != 3) {
                                  __assert_fail("qpdf_oh_get_type_code(qpdf, p_bool) == ot_boolean",
                                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                ,0x2ea,
                                                "void test25(const char *, const char *, const char *, const char *)"
                                               );
                                }
                                __s1 = (char *)qpdf_oh_get_type_name(qpdf,uVar7);
                                iVar8 = strcmp(__s1,"boolean");
                                if (iVar8 != 0) {
                                  __assert_fail("strcmp(qpdf_oh_get_type_name(qpdf, p_bool), \"boolean\") == 0"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                ,0x2eb,
                                                "void test25(const char *, const char *, const char *, const char *)"
                                               );
                                }
                                local_80 = "";
                                local_98 = 0;
                                iVar8 = qpdf_oh_get_value_as_name(qpdf,uVar5);
                                if (((iVar8 != 0) || (*local_80 != '\0')) || (local_98 != 0)) {
                                  __assert_fail("(qpdf_oh_get_value_as_name(qpdf, p_string, &n, &length) == QPDF_FALSE) && (strcmp(n, \"\") == 0) && (length == 0)"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                ,0x2f0,
                                                "void test25(const char *, const char *, const char *, const char *)"
                                               );
                                }
                                iVar8 = qpdf_oh_get_value_as_name(qpdf,local_90,&local_80,&local_98)
                                ;
                                if (iVar8 == 1) {
                                  iVar8 = strcmp(local_80,"/Six");
                                  if ((iVar8 == 0) && (local_98 == 4)) {
                                    qpdf_oh_erase_item(qpdf,uVar2,4);
                                    p_Var1 = qpdf;
                                    uVar3 = qpdf_oh_parse(qpdf,
                                                  "<</A 1 /B 2 /C 3 /D 4 /Type /Test /Subtype /Marvin>>"
                                                  );
                                    qpdf_oh_insert_item(p_Var1,uVar2,2,uVar3);
                                    uVar2 = qpdf_oh_get_array_item(qpdf,uVar2,2);
                                    iVar8 = qpdf_oh_has_key(qpdf,uVar2,"/A");
                                    if (iVar8 == 0) {
                                      __assert_fail("qpdf_oh_has_key(qpdf, new_dict, \"/A\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x2fb,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    iVar8 = qpdf_oh_has_key(qpdf,uVar2,"/D");
                                    if (iVar8 == 0) {
                                      __assert_fail("qpdf_oh_has_key(qpdf, new_dict, \"/D\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x2fc,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    iVar8 = qpdf_oh_is_dictionary_of_type(qpdf,uVar2,"/Test","");
                                    if (iVar8 == 0) {
                                      __assert_fail(
                                                  "qpdf_oh_is_dictionary_of_type(qpdf, new_dict, \"/Test\", \"\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x2fd,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    iVar8 = qpdf_oh_is_dictionary_of_type(qpdf,uVar2,"/Test",0);
                                    if (iVar8 == 0) {
                                      __assert_fail(
                                                  "qpdf_oh_is_dictionary_of_type(qpdf, new_dict, \"/Test\", 0)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x2fe,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    iVar8 = qpdf_oh_is_dictionary_of_type
                                                      (qpdf,uVar2,"/Test","/Marvin");
                                    if (iVar8 == 0) {
                                      __assert_fail(
                                                  "qpdf_oh_is_dictionary_of_type(qpdf, new_dict, \"/Test\", \"/Marvin\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x2ff,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    iVar8 = qpdf_oh_is_dictionary_of_type(qpdf,uVar2,"/Test2","");
                                    if (iVar8 != 0) {
                                      __assert_fail(
                                                  "!qpdf_oh_is_dictionary_of_type(qpdf, new_dict, \"/Test2\", \"\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x300,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    iVar8 = qpdf_oh_is_dictionary_of_type(qpdf,uVar2,"/Test","/M");
                                    if (iVar8 != 0) {
                                      __assert_fail(
                                                  "!qpdf_oh_is_dictionary_of_type(qpdf, new_dict, \"/Test\", \"/M\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x301,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    iVar8 = qpdf_oh_is_dictionary_of_type(qpdf,uVar2,"");
                                    if (iVar8 != 0) {
                                      uVar3 = qpdf_oh_new_array(qpdf);
                                      p_Var1 = qpdf;
                                      uVar4 = qpdf_oh_new_null(qpdf);
                                      qpdf_oh_replace_or_remove_key(p_Var1,uVar2,"/A",uVar4);
                                      qpdf_oh_replace_or_remove_key(qpdf,uVar2,"/B",uVar3);
                                      p_Var1 = qpdf;
                                      uVar4 = qpdf_oh_new_dictionary(qpdf);
                                      qpdf_oh_replace_key(p_Var1,uVar2,"/C",uVar4);
                                      qpdf_oh_remove_key(qpdf,uVar2,"/D");
                                      iVar8 = qpdf_oh_has_key(qpdf,uVar2,"/A");
                                      if (iVar8 != 0) {
                                        __assert_fail("!qpdf_oh_has_key(qpdf, new_dict, \"/A\")",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x308,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                      }
                                      iVar8 = qpdf_oh_has_key(qpdf,uVar2,"/D");
                                      p_Var1 = qpdf;
                                      if (iVar8 == 0) {
                                        uVar4 = qpdf_oh_new_string(qpdf,"potato");
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_unicode_string(qpdf,anon_var_dwarf_da3);
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_binary_unicode_string(qpdf,"qw",8);
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_null(qpdf);
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_null(qpdf);
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_name(qpdf,"/Quack");
                                        qpdf_oh_set_array_item(p_Var1,uVar3,3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_real_from_double
                                                          (0x40107df3b645a1cb,qpdf,2);
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_real_from_string(qpdf,"5.0");
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_integer(qpdf,6);
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        p_Var1 = qpdf;
                                        uVar4 = qpdf_oh_new_bool(qpdf,1);
                                        qpdf_oh_append_item(p_Var1,uVar3,uVar4);
                                        qpdf_oh_replace_key(qpdf,local_5c,"/QTest",uVar2);
                                        qpdf_init_write(qpdf,pcVar9);
                                        qpdf_set_static_ID(qpdf,1);
                                        qpdf_set_qdf_mode(qpdf,1);
                                        qpdf_set_suppress_original_object_IDs(qpdf,1);
                                        qpdf_write(qpdf);
                                        report_errors();
                                        return;
                                      }
                                      __assert_fail("!qpdf_oh_has_key(qpdf, new_dict, \"/D\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x309,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                  );
                                    }
                                    __assert_fail("qpdf_oh_is_dictionary_of_type(qpdf, new_dict, \"\", \"\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                                  ,0x302,
                                                  "void test25(const char *, const char *, const char *, const char *)"
                                                 );
                                  }
                                }
                                __assert_fail("(qpdf_oh_get_value_as_name(qpdf, p_name, &n, &length) == QPDF_TRUE) && (strcmp(n, \"/Six\") == 0) && (length == 4)"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                              ,0x2f3,
                                              "void test25(const char *, const char *, const char *, const char *)"
                                             );
                              }
                            }
                            __assert_fail("qpdf_oh_is_bool(qpdf, p_bool) && (qpdf_oh_get_bool_value(qpdf, p_bool) == QPDF_TRUE)"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                          ,0x2e5,
                                          "void test25(const char *, const char *, const char *, const char *)"
                                         );
                          }
                        }
                        __assert_fail("(qpdf_oh_get_value_as_utf8(qpdf, p_string, &utf8, &length) == QPDF_TRUE) && (strcmp(utf8, \"3\\xc3\\xb7\") == 0) && (length == 3)"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                                      ,0x2d8,
                                      "void test25(const char *, const char *, const char *, const char *)"
                                     );
                      }
                    }
                  }
                }
                __assert_fail("qpdf_oh_is_string(qpdf, p_string) && (strcmp(qpdf_oh_get_string_value(qpdf, p_string), \"3\\xf7\") == 0) && (strcmp(qpdf_oh_get_utf8_value(qpdf, p_string), \"3\\xc3\\xb7\") == 0) && (strcmp(qpdf_oh_unparse_binary(qpdf, p_string), \"<33f7>\") == 0)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                              ,0x2c8,
                              "void test25(const char *, const char *, const char *, const char *)")
                ;
              }
            }
            __assert_fail("(qpdf_oh_get_value_as_real(qpdf, p_real, &r, &length) == QPDF_TRUE) && (strcmp(r, \"2.0\") == 0) && (length == 3)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                          ,0x2c1,
                          "void test25(const char *, const char *, const char *, const char *)");
          }
        }
      }
      __assert_fail("qpdf_oh_is_real(qpdf, p_real) && (strcmp(qpdf_oh_get_real_value(qpdf, p_real), \"2.0\") == 0) && qpdf_oh_get_numeric_value(qpdf, p_real) == 2.0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x2b9,"void test25(const char *, const char *, const char *, const char *)");
    }
  }
  __assert_fail("qpdf_oh_is_integer(qpdf, p_int) && qpdf_oh_get_int_value_as_int(qpdf, p_int) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x2a2,"void test25(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test25(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test case is designed for minimal.pdf. */
    qpdf_read(qpdf, infile, password);
    qpdf_oh root = qpdf_get_root(qpdf);

    /* Parse objects from a string */
    qpdf_oh parsed =
        qpdf_oh_parse(qpdf, "[ 1 2.0 (3\xf7) << /Four [/Five] >> null true false /Six]");
    qpdf_oh p_int = qpdf_oh_get_array_item(qpdf, parsed, 0);
    qpdf_oh p_real = qpdf_oh_get_array_item(qpdf, parsed, 1);
    qpdf_oh p_string = qpdf_oh_get_array_item(qpdf, parsed, 2);
    qpdf_oh p_dict = qpdf_oh_get_array_item(qpdf, parsed, 3);
    qpdf_oh p_null = qpdf_oh_get_array_item(qpdf, parsed, 4);
    qpdf_oh p_bool = qpdf_oh_get_array_item(qpdf, parsed, 5);
    qpdf_oh p_bool_f = qpdf_oh_get_array_item(qpdf, parsed, 6);
    qpdf_oh p_name = qpdf_oh_get_array_item(qpdf, parsed, 7);
    assert(qpdf_oh_is_integer(qpdf, p_int) && qpdf_oh_get_int_value_as_int(qpdf, p_int) == 1);
    long long l = 0;
    assert(qpdf_oh_get_value_as_longlong(qpdf, p_bool, &l) == QPDF_FALSE);
    assert((qpdf_oh_get_value_as_longlong(qpdf, p_int, &l) == QPDF_TRUE) && (l == 1));
    int i = 0;
    assert(qpdf_oh_get_value_as_int(qpdf, p_bool, &i) == QPDF_FALSE);
    assert((qpdf_oh_get_value_as_int(qpdf, p_int, &i) == QPDF_TRUE) && (i == 1));
    unsigned long long ul = 0u;
    assert(qpdf_oh_get_value_as_ulonglong(qpdf, p_bool, &ul) == QPDF_FALSE);
    assert((qpdf_oh_get_value_as_ulonglong(qpdf, p_int, &ul) == QPDF_TRUE) && (ul == 1u));
    unsigned int u = 0u;
    assert(qpdf_oh_get_value_as_uint(qpdf, p_bool, &u) == QPDF_FALSE);
    assert((qpdf_oh_get_value_as_uint(qpdf, p_int, &u) == QPDF_TRUE) && (u == 1u));
    double d = 0.0;
    assert(qpdf_oh_get_value_as_number(qpdf, p_bool, &d) == QPDF_FALSE);
    assert(
        (qpdf_oh_get_value_as_number(qpdf, p_int, &d) == QPDF_TRUE) && ((d - 1.0) < 1e-6) &&
        ((d - 1.0) > -1e-6));
    assert(qpdf_oh_get_type_code(qpdf, p_int) == ot_integer);
    assert(strcmp(qpdf_oh_get_type_name(qpdf, p_int), "integer") == 0);
    assert(
        qpdf_oh_is_real(qpdf, p_real) &&
        (strcmp(qpdf_oh_get_real_value(qpdf, p_real), "2.0") == 0) &&
        qpdf_oh_get_numeric_value(qpdf, p_real) == 2.0);
    const char* r = "";
    size_t length = 0;
    assert(
        (qpdf_oh_get_value_as_real(qpdf, p_name, &r, &length) == QPDF_FALSE) &&
        (strcmp(r, "") == 0) && (length == 0));
    assert(
        (qpdf_oh_get_value_as_real(qpdf, p_real, &r, &length) == QPDF_TRUE) &&
        (strcmp(r, "2.0") == 0) && (length == 3));
    assert(qpdf_oh_get_type_code(qpdf, p_real) == ot_real);
    assert(strcmp(qpdf_oh_get_type_name(qpdf, p_real), "real") == 0);
    assert(
        qpdf_oh_is_string(qpdf, p_string) &&
        (strcmp(qpdf_oh_get_string_value(qpdf, p_string), "3\xf7") == 0) &&
        (strcmp(qpdf_oh_get_utf8_value(qpdf, p_string), "3\xc3\xb7") == 0) &&
        (strcmp(qpdf_oh_unparse_binary(qpdf, p_string), "<33f7>") == 0));
    const char* str = "";
    length = 0;
    assert(
        (qpdf_oh_get_value_as_string(qpdf, p_name, &str, &length) == QPDF_FALSE) &&
        (strcmp(str, "") == 0) && (length == 0));
    assert(
        (qpdf_oh_get_value_as_string(qpdf, p_string, &str, &length) == QPDF_TRUE) &&
        (strcmp(str, "3\xf7") == 0) && (length == 2));
    const char* utf8 = "";
    length = 0;
    assert(
        (qpdf_oh_get_value_as_utf8(qpdf, p_name, &utf8, &length) == QPDF_FALSE) &&
        (strcmp(utf8, "") == 0) && (length == 0));
    assert(
        (qpdf_oh_get_value_as_utf8(qpdf, p_string, &utf8, &length) == QPDF_TRUE) &&
        (strcmp(utf8, "3\xc3\xb7") == 0) && (length == 3));
    assert(qpdf_oh_get_type_code(qpdf, p_string) == ot_string);
    assert(!qpdf_oh_is_name_and_equals(qpdf, p_string, "3\xf7"));
    assert(strcmp(qpdf_oh_get_type_name(qpdf, p_string), "string") == 0);
    assert(qpdf_oh_is_dictionary(qpdf, p_dict));
    qpdf_oh p_five = qpdf_oh_get_key(qpdf, p_dict, "/Four");
    assert(qpdf_oh_is_or_has_name(qpdf, p_five, "/Five"));
    assert(!qpdf_oh_is_name_and_equals(qpdf, p_five, "/Five"));
    assert(qpdf_oh_is_or_has_name(qpdf, qpdf_oh_get_array_item(qpdf, p_five, 0), "/Five"));
    assert(qpdf_oh_is_name_and_equals(qpdf, qpdf_oh_get_array_item(qpdf, p_five, 0), "/Five"));
    assert(qpdf_oh_is_null(qpdf, p_null));
    assert(qpdf_oh_get_type_code(qpdf, p_null) == ot_null);
    assert(strcmp(qpdf_oh_get_type_name(qpdf, p_null), "null") == 0);
    assert(qpdf_oh_is_bool(qpdf, p_bool) && (qpdf_oh_get_bool_value(qpdf, p_bool) == QPDF_TRUE));
    QPDF_BOOL b = QPDF_FALSE;
    assert((qpdf_oh_get_value_as_bool(qpdf, p_int, &b) == QPDF_FALSE) && b == QPDF_FALSE);
    assert((qpdf_oh_get_value_as_bool(qpdf, p_bool, &b) == QPDF_TRUE) && b == QPDF_TRUE);
    assert((qpdf_oh_get_value_as_bool(qpdf, p_bool_f, &b) == QPDF_TRUE) && b == QPDF_FALSE);
    assert(qpdf_oh_get_type_code(qpdf, p_bool) == ot_boolean);
    assert(strcmp(qpdf_oh_get_type_name(qpdf, p_bool), "boolean") == 0);
    const char* n = "";
    length = 0;
    assert(
        (qpdf_oh_get_value_as_name(qpdf, p_string, &n, &length) == QPDF_FALSE) &&
        (strcmp(n, "") == 0) && (length == 0));
    assert(
        (qpdf_oh_get_value_as_name(qpdf, p_name, &n, &length) == QPDF_TRUE) &&
        (strcmp(n, "/Six") == 0) && (length == 4));
    qpdf_oh_erase_item(qpdf, parsed, 4);
    qpdf_oh_insert_item(
        qpdf,
        parsed,
        2,
        qpdf_oh_parse(qpdf, "<</A 1 /B 2 /C 3 /D 4 /Type /Test /Subtype /Marvin>>"));
    qpdf_oh new_dict = qpdf_oh_get_array_item(qpdf, parsed, 2);
    assert(qpdf_oh_has_key(qpdf, new_dict, "/A"));
    assert(qpdf_oh_has_key(qpdf, new_dict, "/D"));
    assert(qpdf_oh_is_dictionary_of_type(qpdf, new_dict, "/Test", ""));
    assert(qpdf_oh_is_dictionary_of_type(qpdf, new_dict, "/Test", 0));
    assert(qpdf_oh_is_dictionary_of_type(qpdf, new_dict, "/Test", "/Marvin"));
    assert(!qpdf_oh_is_dictionary_of_type(qpdf, new_dict, "/Test2", ""));
    assert(!qpdf_oh_is_dictionary_of_type(qpdf, new_dict, "/Test", "/M"));
    assert(qpdf_oh_is_dictionary_of_type(qpdf, new_dict, "", ""));
    qpdf_oh new_array = qpdf_oh_new_array(qpdf);
    qpdf_oh_replace_or_remove_key(qpdf, new_dict, "/A", qpdf_oh_new_null(qpdf));
    qpdf_oh_replace_or_remove_key(qpdf, new_dict, "/B", new_array);
    qpdf_oh_replace_key(qpdf, new_dict, "/C", qpdf_oh_new_dictionary(qpdf));
    qpdf_oh_remove_key(qpdf, new_dict, "/D");
    assert(!qpdf_oh_has_key(qpdf, new_dict, "/A"));
    assert(!qpdf_oh_has_key(qpdf, new_dict, "/D"));
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_string(qpdf, "potato"));
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_unicode_string(qpdf, "qww\xc3\xb7\xcf\x80"));
    qpdf_oh_append_item(
        qpdf, new_array, qpdf_oh_new_binary_unicode_string(qpdf, "qw\x00w\xc3\xb7\xcf\x80", 8));
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_null(qpdf)); /* 2 */
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_null(qpdf)); /* 3 */
    qpdf_oh_set_array_item(qpdf, new_array, 3, qpdf_oh_new_name(qpdf, "/Quack"));
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_real_from_double(qpdf, 4.123, 2));
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_real_from_string(qpdf, "5.0"));
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_integer(qpdf, 6));
    qpdf_oh_append_item(qpdf, new_array, qpdf_oh_new_bool(qpdf, QPDF_TRUE));
    qpdf_oh_replace_key(qpdf, root, "/QTest", new_dict);

    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_qdf_mode(qpdf, QPDF_TRUE);
    qpdf_set_suppress_original_object_IDs(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}